

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYRef<unsigned_short>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ushort uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  GetterXsYs<unsigned_short> *pGVar9;
  TransformerLogLog *pTVar10;
  ImPlotPlot *pIVar11;
  GetterXsYRef<unsigned_short> *pGVar12;
  ImDrawVert *pIVar13;
  uint *puVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ImPlotContext *pIVar19;
  ImPlotContext *pIVar20;
  uint uVar21;
  long lVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  
  pIVar19 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar6 = pGVar9->Count;
  lVar22 = (long)(((pGVar9->Offset + prim + 1) % iVar6 + iVar6) % iVar6) * (long)pGVar9->Stride;
  uVar5 = *(ushort *)((long)pGVar9->Ys + lVar22);
  dVar15 = log10((double)*(ushort *)((long)pGVar9->Xs + lVar22) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar19->CurrentPlot;
  dVar1 = pIVar19->LogDenX;
  dVar2 = (pIVar11->XAxis).Range.Min;
  dVar3 = (pIVar11->XAxis).Range.Max;
  dVar16 = log10((double)uVar5 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  pIVar20 = GImPlot;
  iVar6 = pTVar10->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  pGVar12 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar7 = pGVar12->Count;
  auVar34._8_8_ = dVar16;
  auVar34._0_8_ = dVar15;
  dVar15 = pGVar12->YRef;
  auVar17._8_4_ = SUB84(pIVar19->LogDenY[iVar6],0);
  auVar17._0_8_ = dVar1;
  auVar17._12_4_ = (int)((ulong)pIVar19->LogDenY[iVar6] >> 0x20);
  auVar35 = divpd(auVar34,auVar17);
  dVar1 = pIVar11->YAxis[iVar6].Range.Min;
  IVar4 = pIVar19->PixelRange[iVar6].Min;
  fVar23 = (float)(pIVar19->Mx *
                   (((double)(float)auVar35._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
  fVar25 = (float)(pIVar19->My[iVar6] *
                   (((double)(float)auVar35._8_8_ * (pIVar11->YAxis[iVar6].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  dVar16 = log10((double)*(ushort *)
                          ((long)pGVar12->Xs +
                          (long)(((prim + 1 + pGVar12->Offset) % iVar7 + iVar7) % iVar7) *
                          (long)pGVar12->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = pIVar20->CurrentPlot;
  dVar1 = pIVar20->LogDenX;
  dVar2 = (pIVar11->XAxis).Range.Min;
  dVar3 = (pIVar11->XAxis).Range.Max;
  dVar15 = log10(dVar15 / pIVar11->YAxis[pTVar10->YAxis].Range.Min);
  iVar6 = pTVar10->YAxis;
  auVar28._8_8_ = dVar15;
  auVar28._0_8_ = dVar16;
  auVar35._8_4_ = SUB84(pIVar20->LogDenY[iVar6],0);
  auVar35._0_8_ = dVar1;
  auVar35._12_4_ = (int)((ulong)pIVar20->LogDenY[iVar6] >> 0x20);
  auVar35 = divpd(auVar28,auVar35);
  pIVar11 = pIVar20->CurrentPlot;
  dVar1 = pIVar11->YAxis[iVar6].Range.Min;
  IVar4 = pIVar20->PixelRange[iVar6].Min;
  fVar24 = (float)(pIVar20->Mx *
                   (((double)(float)auVar35._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar11->XAxis).Range.Min) + (double)IVar4.x);
  fVar26 = (float)(pIVar20->My[iVar6] *
                   (((double)(float)auVar35._8_8_ * (pIVar11->YAxis[iVar6].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar30 = (this->P12).x;
  fVar31 = (this->P12).y;
  fVar33 = (this->P11).x;
  fVar36 = (this->P11).y;
  fVar27 = fVar25 * fVar33 - fVar23 * fVar36;
  fVar37 = fVar30 * fVar26 - fVar31 * fVar24;
  fVar33 = fVar33 - fVar23;
  fVar30 = fVar30 - fVar24;
  fVar32 = fVar31 - fVar26;
  fVar38 = fVar32 * fVar33 - (fVar36 - fVar25) * fVar30;
  auVar29._0_4_ = fVar27 * fVar30 - fVar37 * fVar33;
  auVar29._4_4_ = fVar27 * fVar32 - fVar37 * (fVar36 - fVar25);
  auVar29._8_4_ = fVar25 * 0.0 - fVar31 * 0.0;
  auVar29._12_4_ = fVar25 * 0.0 - fVar31 * 0.0;
  auVar18._4_4_ = fVar38;
  auVar18._0_4_ = fVar38;
  auVar18._8_4_ = fVar32;
  auVar18._12_4_ = fVar32;
  auVar35 = divps(auVar29,auVar18);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13->col = this->Col;
  pIVar13[1].pos.x = fVar23;
  pIVar13[1].pos.y = fVar25;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[1].col = this->Col;
  pIVar13[2].pos = auVar35._0_8_;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[2].col = this->Col;
  pIVar13[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[3].col = this->Col;
  IVar4.y = fVar26;
  IVar4.x = fVar24;
  pIVar13[4].pos = IVar4;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar13 = DrawList->_VtxWritePtr;
  pIVar13[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar13 + 5;
  uVar8 = DrawList->_VtxCurrentIdx;
  puVar14 = DrawList->_IdxWritePtr;
  *puVar14 = uVar8;
  uVar21 = -(uint)(fVar31 < fVar36 && fVar25 < fVar26 || fVar26 < fVar25 && fVar36 < fVar31) & 1;
  puVar14[1] = uVar8 + uVar21 + 1;
  puVar14[2] = DrawList->_VtxCurrentIdx + 3;
  puVar14[3] = DrawList->_VtxCurrentIdx + 1;
  puVar14[4] = (uVar21 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar14[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar14 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar23;
  (this->P11).y = fVar25;
  (this->P12).x = fVar24;
  (this->P12).y = fVar26;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }